

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Sifm::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Sifm *this)

{
  uint32_t uVar1;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_02;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_03;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_04;
  SingleMthdTest *pSVar2;
  result_type rVar3;
  MthdNotify *this_00;
  MthdPatch *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdDmaGrobj *this_04;
  MthdCtxPattern *this_05;
  MthdCtxRop *this_06;
  MthdCtxBeta *this_07;
  MthdMissing *this_08;
  MthdSifmFormat *this_09;
  MthdOperation *this_10;
  MthdClipXy *this_11;
  MthdClipRect *this_12;
  MthdSifmXy *this_13;
  MthdSifmRect *this_14;
  MthdSifmDuDx *this_15;
  MthdSifmDvDy *this_16;
  MthdSifmSrcSize *this_17;
  MthdSifmPitch *this_18;
  MthdSifmOffset *this_19;
  MthdSifmSrcPos *this_20;
  MthdSyfmPitch *this_21;
  MthdSyfmOffset *this_22;
  MthdSyfmSrcPos *this_23;
  MthdSifmInvalid *this_24;
  MthdCtxSurf *this_25;
  MthdCtxSurf2D *this_26;
  allocator local_6f9;
  string local_6f8 [32];
  SingleMthdTest *local_6d8;
  iterator local_6d0;
  undefined8 local_6c8;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_6c0;
  const_iterator local_6b8;
  SingleMthdTest **local_6b0;
  undefined1 local_6a2;
  allocator local_6a1;
  string local_6a0 [32];
  SingleMthdTest *local_680;
  iterator local_678;
  undefined8 local_670;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_668;
  const_iterator local_660;
  SingleMthdTest **local_658;
  undefined1 local_64a;
  allocator local_649;
  string local_648 [38];
  undefined1 local_622;
  allocator local_621;
  string local_620 [32];
  SingleMthdTest *local_600;
  MthdCtxSurf2D *local_5f8;
  iterator local_5f0;
  undefined8 local_5e8;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_5e0;
  const_iterator local_5d8;
  SingleMthdTest **local_5d0;
  undefined1 local_5c2;
  allocator local_5c1;
  string local_5c0 [32];
  MthdCtxSurf *local_5a0;
  MthdCtxSurf **local_598;
  undefined8 local_590;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_588;
  const_iterator local_580;
  SingleMthdTest **local_578;
  undefined1 local_56a;
  allocator local_569;
  string local_568 [38];
  undefined1 local_542;
  allocator local_541;
  string local_540 [38];
  undefined1 local_51a;
  allocator local_519;
  string local_518 [38];
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0 [38];
  undefined1 local_4ca;
  allocator local_4c9;
  string local_4c8 [32];
  SingleMthdTest *local_4a8;
  MthdSyfmPitch *local_4a0;
  MthdSyfmOffset *local_498;
  MthdSyfmSrcPos *local_490;
  MthdSifmInvalid *local_488;
  iterator local_480;
  undefined8 local_478;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_470;
  const_iterator local_468;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_45b;
  undefined1 local_45a;
  allocator local_459;
  string local_458 [38];
  undefined1 local_432;
  allocator local_431;
  string local_430 [38];
  undefined1 local_40a;
  allocator local_409;
  string local_408 [38];
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [38];
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [38];
  undefined1 local_27a;
  allocator local_279;
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [38];
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [38];
  undefined1 local_18a;
  allocator local_189;
  string local_188 [38];
  undefined1 local_162;
  allocator local_161;
  string local_160 [38];
  undefined1 local_13a;
  allocator local_139;
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [48];
  SingleMthdTest *local_e0;
  MthdNotify *local_d8;
  MthdPatch *local_d0;
  MthdPmTrigger *local_c8;
  MthdDmaNotify *local_c0;
  MthdDmaGrobj *local_b8;
  MthdCtxPattern *local_b0;
  MthdCtxRop *local_a8;
  MthdCtxBeta *local_a0;
  MthdMissing *local_98;
  MthdSifmFormat *local_90;
  MthdOperation *local_88;
  MthdClipXy *local_80;
  MthdClipRect *local_78;
  MthdSifmXy *local_70;
  MthdSifmRect *local_68;
  MthdSifmDuDx *local_60;
  MthdSifmDvDy *local_58;
  MthdSifmSrcSize *local_50;
  MthdSifmPitch *local_48;
  MthdSifmOffset *local_40;
  MthdSifmSrcPos *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Sifm *local_18;
  Sifm *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Sifm *)__return_storage_ptr__;
  pSVar2 = (SingleMthdTest *)operator_new(0x25950);
  local_112 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"nop",&local_111);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_110,-1,
             (this->super_Class).cls,0x100,1,4);
  local_112 = 0;
  local_e0 = pSVar2;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_13a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"notify",&local_139);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_138,0,
             (this->super_Class).cls,0x104,1,4);
  local_13a = 0;
  local_d8 = this_00;
  this_01 = (MthdPatch *)operator_new(0x25950);
  local_162 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"patch",&local_161);
  MthdPatch::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_160,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_162 = 0;
  local_d0 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_18a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"pm_trigger",&local_189);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_188,-1,
             (this->super_Class).cls,0x140,1,4);
  local_18a = 0;
  local_c8 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_1b2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"dma_notify",&local_1b1);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1b0,1,
             (this->super_Class).cls,0x180,1,4);
  local_1b2 = 0;
  local_c0 = this_03;
  this_04 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1da = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"dma_src",&local_1d9);
  MthdDmaGrobj::MthdDmaGrobj
            (this_04,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1d8,2,
             (this->super_Class).cls,0x184,0,0);
  local_1da = 0;
  local_b8 = this_04;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_202 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"ctx_pattern",&local_201);
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (this_05,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_200,3,uVar1,0x188,
             uVar1 != 0x37);
  local_202 = 0;
  local_b0 = this_05;
  this_06 = (MthdCtxRop *)operator_new(0x25950);
  local_22a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"ctx_rop",&local_229);
  MthdCtxRop::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_228,4,
             (this->super_Class).cls,0x18c,1,4);
  local_22a = 0;
  local_a8 = this_06;
  this_07 = (MthdCtxBeta *)operator_new(0x25950);
  local_252 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"ctx_beta",&local_251);
  MthdCtxBeta::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_250,5,
             (this->super_Class).cls,400,1,4);
  local_252 = 0;
  local_a0 = this_07;
  this_08 = (MthdMissing *)operator_new(0x25950);
  local_27a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"missing",&local_279);
  MthdMissing::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_278,-1,
             (this->super_Class).cls,0x200,1,4);
  local_27a = 0;
  local_98 = this_08;
  this_09 = (MthdSifmFormat *)operator_new(0x25958);
  local_2a2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"format",&local_2a1);
  uVar1 = (this->super_Class).cls;
  anon_unknown_17::MthdSifmFormat::MthdSifmFormat
            (this_09,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2a0,8,uVar1,0x300,
             uVar1 != 0x37);
  local_2a2 = 0;
  local_90 = this_09;
  this_10 = (MthdOperation *)operator_new(0x25958);
  local_2ca = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"operation",&local_2c9);
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (this_10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2c8,9,uVar1,0x304,
             uVar1 != 0x37);
  local_2ca = 0;
  local_88 = this_10;
  this_11 = (MthdClipXy *)operator_new(0x25958);
  local_2f2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"clip_xy",&local_2f1);
  MthdClipXy::MthdClipXy
            (this_11,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2f0,10,
             (this->super_Class).cls,0x308,1,false);
  local_2f2 = 0;
  local_80 = this_11;
  this_12 = (MthdClipRect *)operator_new(0x25958);
  local_31a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"clip_rect",&local_319);
  MthdClipRect::MthdClipRect
            (this_12,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_318,0xb,
             (this->super_Class).cls,0x30c,1);
  local_31a = 0;
  local_78 = this_12;
  this_13 = (MthdSifmXy *)operator_new(0x25950);
  local_342 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"xy",&local_341);
  anon_unknown_17::MthdSifmXy::SingleMthdTest
            (this_13,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_340,0xc,
             (this->super_Class).cls,0x310,1,4);
  local_342 = 0;
  local_70 = this_13;
  this_14 = (MthdSifmRect *)operator_new(0x25950);
  local_36a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"rect",&local_369);
  uVar1 = (this->super_Class).cls;
  anon_unknown_17::MthdSifmRect::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_368,
             (uVar1 != 0x37) + 0xb + (uint)(uVar1 != 0x37),uVar1,0x314,1,4);
  local_36a = 0;
  local_68 = this_14;
  this_15 = (MthdSifmDuDx *)operator_new(0x25958);
  local_392 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"dudx",&local_391);
  anon_unknown_17::MthdSifmDuDx::MthdSifmDuDx
            (this_15,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_390,0xe,
             (this->super_Class).cls,0x318,0);
  local_392 = 0;
  local_60 = this_15;
  this_16 = (MthdSifmDvDy *)operator_new(0x25958);
  local_3ba = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"dvdy",&local_3b9);
  anon_unknown_17::MthdSifmDvDy::MthdSifmDvDy
            (this_16,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3b8,0xf,
             (this->super_Class).cls,0x31c,0);
  local_3ba = 0;
  local_58 = this_16;
  this_17 = (MthdSifmSrcSize *)operator_new(0x25958);
  local_3e2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"src_size",&local_3e1);
  anon_unknown_17::MthdSifmSrcSize::MthdSifmSrcSize
            (this_17,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3e0,0x10,
             (this->super_Class).cls,0x400,0);
  local_3e2 = 0;
  local_50 = this_17;
  this_18 = (MthdSifmPitch *)operator_new(0x25950);
  local_40a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"pitch",&local_409);
  anon_unknown_17::MthdSifmPitch::SingleMthdTest
            (this_18,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_408,0x11,
             (this->super_Class).cls,0x404,1,4);
  local_40a = 0;
  local_48 = this_18;
  this_19 = (MthdSifmOffset *)operator_new(0x25958);
  local_432 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"offset",&local_431);
  anon_unknown_17::MthdSifmOffset::MthdSifmOffset
            (this_19,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_430,0x12,
             (this->super_Class).cls,0x408,0);
  local_432 = 0;
  local_40 = this_19;
  this_20 = (MthdSifmSrcPos *)operator_new(0x25958);
  local_45a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"src_pos",&local_459);
  anon_unknown_17::MthdSifmSrcPos::MthdSifmSrcPos
            (this_20,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_458,0x13,
             (this->super_Class).cls,0x40c,0,true);
  local_45a = 0;
  local_30 = &local_e0;
  local_28 = 0x16;
  local_38 = this_20;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_45b);
  __l_04._M_len = local_28;
  __l_04._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_04,&local_45b);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_45b);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  if ((this->super_Class).cls == 0xe) {
    local_470._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_468,&local_470);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_4ca = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"src_size_yuv420",&local_4c9);
    anon_unknown_17::MthdSyfmSrcSize::SingleMthdTest
              ((MthdSyfmSrcSize *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,
               (string *)local_4c8,-1,(this->super_Class).cls,0x400,1,4);
    local_4ca = 0;
    local_4a8 = pSVar2;
    this_21 = (MthdSyfmPitch *)operator_new(0x25950);
    local_4f2 = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"pitch_yuv420",&local_4f1);
    anon_unknown_17::MthdSyfmPitch::SingleMthdTest
              (this_21,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4f0,-1,
               (this->super_Class).cls,0x404,1,4);
    local_4f2 = 0;
    local_4a0 = this_21;
    this_22 = (MthdSyfmOffset *)operator_new(0x25950);
    local_51a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"offset_yuv420",&local_519);
    anon_unknown_17::MthdSyfmOffset::SingleMthdTest
              (this_22,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_518,-1,
               (this->super_Class).cls,0x408,3,4);
    local_51a = 0;
    local_498 = this_22;
    this_23 = (MthdSyfmSrcPos *)operator_new(0x25950);
    local_542 = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"src_pos_yuv420",&local_541);
    anon_unknown_17::MthdSyfmSrcPos::SingleMthdTest
              (this_23,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_540,-1,
               (this->super_Class).cls,0x414,1,4);
    local_542 = 0;
    local_490 = this_23;
    this_24 = (MthdSifmInvalid *)operator_new(0x25950);
    local_56a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"invalid_yuv420",&local_569);
    anon_unknown_17::MthdSifmInvalid::SingleMthdTest
              (this_24,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_568,-1,
               (this->super_Class).cls,0x410,2,4);
    local_56a = 0;
    local_480 = &local_4a8;
    local_478 = 5;
    __l_03._M_len = 5;
    __l_03._M_array = local_480;
    local_488 = this_24;
    local_578 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_468,__l_03);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  }
  if ((this->super_Class).cls == 0x37) {
    local_588._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_580,&local_588);
    this_25 = (MthdCtxSurf *)operator_new(0x25958);
    local_5c2 = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"ctx_dst",&local_5c1);
    MthdCtxSurf::MthdCtxSurf
              (this_25,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_5c0,7,
               (this->super_Class).cls,0x194,0);
    local_5c2 = 0;
    local_598 = &local_5a0;
    local_590 = 1;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_598;
    local_5a0 = this_25;
    local_5d0 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_580,__l_02);
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  }
  else {
    local_5e0._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_5d8,&local_5e0);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_622 = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_620,"ctx_beta4",&local_621);
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_620,6
               ,(this->super_Class).cls,0x194,1,4);
    local_622 = 0;
    local_600 = pSVar2;
    this_26 = (MthdCtxSurf2D *)operator_new(0x25958);
    local_64a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"ctx_surf2d",&local_649);
    uVar1 = (this->super_Class).cls;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_26,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_648,7,uVar1,0x198,
               uVar1 == 0x77 ^ 3);
    local_64a = 0;
    local_5f0 = &local_600;
    local_5e8 = 2;
    __l_01._M_len = 2;
    __l_01._M_array = local_5f0;
    local_5f8 = this_26;
    local_658 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_5d8,__l_01);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    std::__cxx11::string::~string(local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
  }
  if (((this->super_Class).cls == 99) || (((this->super_Class).cls & 0xff) == 0x89)) {
    local_668._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::begin(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_660,&local_668);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_6a2 = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a0,"dither",&local_6a1);
    MthdDither::SingleMthdTest
              ((MthdDither *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_6a0,
               0x14,(this->super_Class).cls,0x2fc,1,4);
    local_6a2 = 0;
    local_678 = &local_680;
    local_670 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = local_678;
    local_680 = pSVar2;
    local_6b0 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_660,__l_00);
    std::__cxx11::string::~string(local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  }
  if (((this->super_Class).cls & 0xff) == 0x89) {
    local_6c0._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::begin(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_6b8,&local_6c0);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6f8,"sync",&local_6f9);
    MthdSync::SingleMthdTest
              ((MthdSync *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_6f8,-1,
               (this->super_Class).cls,0x108,1,4);
    local_6d0 = &local_6d8;
    local_6c8 = 1;
    __l._M_len = 1;
    __l._M_array = local_6d0;
    local_6d8 = pSVar2;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_6b8,__l);
    std::__cxx11::string::~string(local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Sifm::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_src", 2, cls, 0x184, 0, DMA_R),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x37),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdSifmFormat(opt, rnd(), "format", 8, cls, 0x300, cls != 0x37),
		new MthdOperation(opt, rnd(), "operation", 9, cls, 0x304, cls != 0x37),
		new MthdClipXy(opt, rnd(), "clip_xy", 10, cls, 0x308, 1, 0),
		new MthdClipRect(opt, rnd(), "clip_rect", 11, cls, 0x30c, 1),
		new MthdSifmXy(opt, rnd(), "xy", 12, cls, 0x310),
		new MthdSifmRect(opt, rnd(), "rect", cls == 0x37 ? 11 : 13, cls, 0x314),
		new MthdSifmDuDx(opt, rnd(), "dudx", 14, cls, 0x318, 0),
		new MthdSifmDvDy(opt, rnd(), "dvdy", 15, cls, 0x31c, 0),
		new MthdSifmSrcSize(opt, rnd(), "src_size", 16, cls, 0x400, 0),
		new MthdSifmPitch(opt, rnd(), "pitch", 17, cls, 0x404),
		new MthdSifmOffset(opt, rnd(), "offset", 18, cls, 0x408, 0),
		new MthdSifmSrcPos(opt, rnd(), "src_pos", 19, cls, 0x40c, 0, true),
	};
	if (cls == 0xe) {
		res.insert(res.end(), {
			new MthdSyfmSrcSize(opt, rnd(), "src_size_yuv420", -1, cls, 0x400),
			new MthdSyfmPitch(opt, rnd(), "pitch_yuv420", -1, cls, 0x404),
			new MthdSyfmOffset(opt, rnd(), "offset_yuv420", -1, cls, 0x408, 3),
			new MthdSyfmSrcPos(opt, rnd(), "src_pos_yuv420", -1, cls, 0x414),
			new MthdSifmInvalid(opt, rnd(), "invalid_yuv420", -1, cls, 0x410, 2),
		});
	}
	if (cls == 0x37) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, (cls == 0x77 ? SURF2D_NV4 : SURF2D_NV10) | SURF2D_SWZOK),
		});
	}
	if (cls == 0x63 || (cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdDither(opt, rnd(), "dither", 20, cls, 0x2fc),
		});
	}
	if ((cls & 0xff) == 0x89) {
		res.insert(res.begin(), {
			new MthdSync(opt, rnd(), "sync", -1, cls, 0x108),
		});
	}
	return res;
}